

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::DescriptorProto::SerializeWithCachedSizesToArray
          (DescriptorProto *this,uint8 *target)

{
  string *str;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  uint8 *puVar2;
  Type *pTVar3;
  Type *this_00;
  Type *this_01;
  Type *this_02;
  int i;
  int iVar4;
  MessageOptions *this_03;
  
  if ((this->_has_bits_[0] & 1) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,SERIALIZE);
    str = this->name_;
    *target = '\n';
    puVar2 = io::CodedOutputStream::WriteVarint32ToArray((uint32)str->_M_string_length,target + 1);
    target = io::CodedOutputStream::WriteStringToArray(str,puVar2);
  }
  for (iVar4 = 0; iVar4 < (this->field_).super_RepeatedPtrFieldBase.current_size_; iVar4 = iVar4 + 1
      ) {
    pTVar3 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(this->field_).super_RepeatedPtrFieldBase,iVar4);
    *target = '\x12';
    puVar2 = io::CodedOutputStream::WriteVarint32ToArray(pTVar3->_cached_size_,target + 1);
    target = FieldDescriptorProto::SerializeWithCachedSizesToArray(pTVar3,puVar2);
  }
  for (iVar4 = 0; iVar4 < (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = iVar4 + 1) {
    this_00 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                        (&(this->nested_type_).super_RepeatedPtrFieldBase,iVar4);
    *target = '\x1a';
    puVar2 = io::CodedOutputStream::WriteVarint32ToArray(this_00->_cached_size_,target + 1);
    target = SerializeWithCachedSizesToArray(this_00,puVar2);
  }
  for (iVar4 = 0; iVar4 < (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = iVar4 + 1) {
    this_01 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                        (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar4);
    *target = '\"';
    puVar2 = io::CodedOutputStream::WriteVarint32ToArray(this_01->_cached_size_,target + 1);
    target = EnumDescriptorProto::SerializeWithCachedSizesToArray(this_01,puVar2);
  }
  for (iVar4 = 0; iVar4 < (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = iVar4 + 1) {
    this_02 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                        (&(this->extension_range_).super_RepeatedPtrFieldBase,iVar4);
    *target = '*';
    puVar2 = io::CodedOutputStream::WriteVarint32ToArray(this_02->_cached_size_,target + 1);
    target = DescriptorProto_ExtensionRange::SerializeWithCachedSizesToArray(this_02,puVar2);
  }
  for (iVar4 = 0; iVar4 < (this->extension_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = iVar4 + 1) {
    pTVar3 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(this->extension_).super_RepeatedPtrFieldBase,iVar4);
    *target = '2';
    puVar2 = io::CodedOutputStream::WriteVarint32ToArray(pTVar3->_cached_size_,target + 1);
    target = FieldDescriptorProto::SerializeWithCachedSizesToArray(pTVar3,puVar2);
  }
  if ((this->_has_bits_[0] & 0x40) != 0) {
    this_03 = this->options_;
    if (this_03 == (MessageOptions *)0x0) {
      this_03 = *(MessageOptions **)(default_instance_ + 0x90);
    }
    *target = ':';
    puVar2 = io::CodedOutputStream::WriteVarint32ToArray(this_03->_cached_size_,target + 1);
    target = MessageOptions::SerializeWithCachedSizesToArray(this_03,puVar2);
  }
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar2 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,target);
    return puVar2;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* DescriptorProto::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  for (int i = 0; i < this->field_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        2, this->field(i), target);
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  for (int i = 0; i < this->nested_type_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        3, this->nested_type(i), target);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  for (int i = 0; i < this->enum_type_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        4, this->enum_type(i), target);
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  for (int i = 0; i < this->extension_range_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        5, this->extension_range(i), target);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  for (int i = 0; i < this->extension_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        6, this->extension(i), target);
  }

  // optional .google.protobuf.MessageOptions options = 7;
  if (has_options()) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        7, this->options(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}